

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sym.cpp
# Opt level: O0

PropertySym *
PropertySym::New(StackSym *stackSym,int32 propertyId,uint32 propertyIdIndex,uint inlineCacheIndex,
                PropertyKind fieldKind,Func *func)

{
  SymID SVar1;
  JitArenaAllocator *pJVar2;
  PropertySym *this;
  ObjectSymInfo *pOVar3;
  ObjectSymInfo *objectSymInfo;
  TrackAllocData local_58;
  PropertySym *local_30;
  PropertySym *propertySym;
  Func *func_local;
  uint32 uStack_18;
  PropertyKind fieldKind_local;
  uint inlineCacheIndex_local;
  uint32 propertyIdIndex_local;
  int32 propertyId_local;
  StackSym *stackSym_local;
  
  pJVar2 = func->m_alloc;
  propertySym = (PropertySym *)func;
  func_local._3_1_ = fieldKind;
  func_local._4_4_ = inlineCacheIndex;
  uStack_18 = propertyIdIndex;
  inlineCacheIndex_local = propertyId;
  _propertyIdIndex_local = stackSym;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_58,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
             ,0x3c8);
  pJVar2 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar2,&local_58);
  this = (PropertySym *)new<Memory::JitArenaAllocator>(0x60,pJVar2,0x4e9be0);
  memset(this,0,0x60);
  PropertySym(this);
  this->m_func = (Func *)propertySym;
  local_30 = this;
  SVar1 = SymTable::NewID((SymTable *)propertySym[4].m_writeGuardSym);
  (local_30->super_Sym).m_id = SVar1;
  (local_30->super_Sym).m_kind = SymKindProperty;
  local_30->m_propertyId = inlineCacheIndex_local;
  local_30->m_propertyIdIndex = 0xffffffff;
  local_30->m_inlineCacheIndex = 0xffffffff;
  uStack_18 = 0xffffffff;
  func_local._4_4_ = 0xffffffff;
  local_30->m_loadInlineCacheIndex = 0xffffffff;
  local_30->m_loadInlineCacheFunc = (Func *)0x0;
  (local_30->super_Sym).field_0x15 = func_local._3_1_;
  local_30->m_stackSym = _propertyIdIndex_local;
  local_30->m_propertyEquivSet = (BVSparse<Memory::JitArenaAllocator> *)0x0;
  SymTable::Add((SymTable *)propertySym[4].m_writeGuardSym,&local_30->super_Sym);
  pOVar3 = StackSym::EnsureObjectInfo(_propertyIdIndex_local,(Func *)propertySym);
  local_30->m_nextInStackSymList = pOVar3->m_propertySymList;
  pOVar3->m_propertySymList = local_30;
  return local_30;
}

Assistant:

PropertySym *
PropertySym::New(StackSym *stackSym, int32 propertyId, uint32 propertyIdIndex, uint inlineCacheIndex, PropertyKind fieldKind, Func *func)
{
    PropertySym *  propertySym;

    propertySym = JitAnewZ(func->m_alloc, PropertySym);

    propertySym->m_func = func;
    propertySym->m_id = func->m_symTable->NewID();
    propertySym->m_kind = SymKindProperty;

    propertySym->m_propertyId = propertyId;

    propertyIdIndex = (uint)-1;
    inlineCacheIndex = (uint)-1;

    propertySym->m_propertyIdIndex = propertyIdIndex;
    propertySym->m_inlineCacheIndex = inlineCacheIndex;
    Assert(propertyIdIndex == (uint)-1 || inlineCacheIndex == (uint)-1);
    propertySym->m_loadInlineCacheIndex = (uint)-1;
    propertySym->m_loadInlineCacheFunc = nullptr;
    propertySym->m_fieldKind = fieldKind;

    propertySym->m_stackSym = stackSym;
    propertySym->m_propertyEquivSet = nullptr;

    // Add to list

    func->m_symTable->Add(propertySym);

    // Keep track of all the property we use from this sym so we can invalidate
    // the value in glob opt
    ObjectSymInfo * objectSymInfo = stackSym->EnsureObjectInfo(func);
    propertySym->m_nextInStackSymList = objectSymInfo->m_propertySymList;
    objectSymInfo->m_propertySymList = propertySym;

    return propertySym;
}